

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase315::run(TestCase315 *this)

{
  Reader node;
  Reader brand;
  Reader brand_00;
  bool bVar1;
  uint64_t uVar2;
  ArrayPtr<const_char> AVar3;
  Schema local_380;
  Reader local_378;
  Schema local_340;
  bool local_331;
  Schema SStack_330;
  bool _kj_shouldLog_4;
  Reader local_328;
  Schema local_2f0;
  Schema *local_2e8;
  undefined1 local_2e0 [8];
  DebugComparison<capnp::Schema_&,_capnp::Schema> _kjCondition_4;
  bool local_2a9;
  Schema SStack_2a8;
  bool _kj_shouldLog_3;
  Schema *local_2a0;
  undefined1 local_298 [8];
  DebugComparison<capnp::Schema_&,_capnp::Schema> _kjCondition_3;
  Reader local_268;
  ArrayPtr<const_char> local_238;
  Reader local_228;
  ArrayPtr<const_char> local_1f8;
  bool local_1e1;
  Schema SStack_1e0;
  bool _kj_shouldLog_2;
  Reader local_1d8;
  ArrayPtr<const_char> local_1a8;
  Reader local_198;
  ArrayPtr<const_char> local_168;
  ArrayPtr<const_char> local_158;
  undefined1 local_148 [8];
  DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> _kjCondition_2;
  bool _kj_shouldLog_1;
  Schema SStack_108;
  DebugExpression<bool> _kjCondition_1;
  Schema dep;
  bool _kj_shouldLog;
  DebugExpression<bool> _kjCondition;
  Schema local_f0;
  Reader local_e8;
  Schema local_b8;
  Schema schema;
  SchemaLoader loader;
  Reader local_80;
  undefined1 local_50 [8];
  FakeLoaderCallback callback;
  TestCase315 *this_local;
  
  callback._56_8_ = this;
  loader.impl.value.ptr = (Impl *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  Schema::getProto(&local_80,(Schema *)&loader.impl.value.ptr);
  node._reader.capTable = local_80._reader.capTable;
  node._reader.segment = local_80._reader.segment;
  node._reader.data = local_80._reader.data;
  node._reader.pointers = local_80._reader.pointers;
  node._reader.dataSize = local_80._reader.dataSize;
  node._reader.pointerCount = local_80._reader.pointerCount;
  node._reader._38_2_ = local_80._reader._38_2_;
  node._reader.nestingLimit = local_80._reader.nestingLimit;
  node._reader._44_4_ = local_80._reader._44_4_;
  FakeLoaderCallback::FakeLoaderCallback((FakeLoaderCallback *)local_50,node);
  SchemaLoader::SchemaLoader((SchemaLoader *)&schema,(LazyLoadCallback *)local_50);
  local_f0.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestDefaults>();
  Schema::getProto(&local_e8,&local_f0);
  local_b8 = SchemaLoader::load((SchemaLoader *)&schema,&local_e8);
  bVar1 = FakeLoaderCallback::isLoaded((FakeLoaderCallback *)local_50);
  dep.raw._2_1_ = !bVar1;
  dep.raw._3_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&dep.raw + 2));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&dep.raw + 3));
  if (!bVar1) {
    dep.raw._1_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)dep.raw._1_1_ != false) {
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x141,ERROR,"\"failed: expected \" \"!(callback.isLoaded())\", _kjCondition",
                 (char (*) [40])"failed: expected !(callback.isLoaded())",
                 (DebugExpression<bool> *)((long)&dep.raw + 3));
      dep.raw._1_1_ = false;
    }
  }
  uVar2 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                    ();
  SStack_108 = Schema::getDependency(&local_b8,uVar2);
  _kjCondition_2._54_1_ = FakeLoaderCallback::isLoaded((FakeLoaderCallback *)local_50);
  _kjCondition_2._55_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_2.field_0x36);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_2.field_0x37);
  if (!bVar1) {
    _kjCondition_2._53_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._53_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x145,ERROR,"\"failed: expected \" \"callback.isLoaded()\", _kjCondition",
                 (char (*) [37])"failed: expected callback.isLoaded()",
                 (DebugExpression<bool> *)&_kjCondition_2.field_0x37);
      _kjCondition_2._53_1_ = 0;
    }
  }
  Schema::getProto(&local_198,&stack0xfffffffffffffef8);
  local_168 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_198);
  local_158 = (ArrayPtr<const_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_168);
  SStack_1e0.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  Schema::getProto(&local_1d8,&stack0xfffffffffffffe20);
  local_1a8 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_1d8);
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            ((DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)local_148,
             (DebugExpression<capnp::Text::Reader> *)&local_158,(Reader *)&local_1a8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_148);
  if (!bVar1) {
    local_1e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e1 != false) {
      Schema::getProto(&local_228,&stack0xfffffffffffffef8);
      AVar3 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_228);
      local_1f8 = AVar3;
      _kjCondition_3._32_8_ = Schema::from<capnproto_test::capnp::test::TestAllTypes>();
      Schema::getProto(&local_268,(Schema *)&_kjCondition_3.result);
      AVar3 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_268);
      local_238 = AVar3;
      kj::_::Debug::
      log<char_const(&)[113],kj::_::DebugComparison<capnp::Text::Reader,capnp::Text::Reader>&,capnp::Text::Reader,capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x148,ERROR,
                 "\"failed: expected \" \"(dep.getProto().getDisplayName()) == (Schema::from<TestAllTypes>().getProto().getDisplayName())\", _kjCondition, dep.getProto().getDisplayName(), Schema::from<TestAllTypes>().getProto().getDisplayName()"
                 ,(char (*) [113])
                  "failed: expected (dep.getProto().getDisplayName()) == (Schema::from<TestAllTypes>().getProto().getDisplayName())"
                 ,(DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)local_148,
                 (Reader *)&local_1f8,(Reader *)&local_238);
      local_1e1 = false;
    }
  }
  local_2a0 = (Schema *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffef8);
  uVar2 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                    ();
  SStack_2a8 = Schema::getDependency(&local_b8,uVar2);
  kj::_::DebugExpression<capnp::Schema&>::operator==
            ((DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_298,
             (DebugExpression<capnp::Schema&> *)&local_2a0,&stack0xfffffffffffffd58);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_298);
  if (!bVar1) {
    local_2a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2a9 != false) {
      uVar2 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                        ();
      _kjCondition_4._32_8_ = Schema::getDependency(&local_b8,uVar2);
      kj::_::Debug::
      log<char_const(&)[73],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&,capnp::Schema&,capnp::Schema>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x14a,ERROR,
                 "\"failed: expected \" \"(dep) == (schema.getDependency(typeId<TestAllTypes>()))\", _kjCondition, dep, schema.getDependency(typeId<TestAllTypes>())"
                 ,(char (*) [73])
                  "failed: expected (dep) == (schema.getDependency(typeId<TestAllTypes>()))",
                 (DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_298,
                 &stack0xfffffffffffffef8,(Schema *)&_kjCondition_4.result);
      local_2a9 = false;
    }
  }
  local_2e8 = (Schema *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffef8);
  uVar2 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                    ();
  local_328._reader.dataSize = 0;
  local_328._reader.pointerCount = 0;
  local_328._reader._38_2_ = 0;
  local_328._reader.nestingLimit = 0;
  local_328._reader._44_4_ = 0;
  local_328._reader.data = (void *)0x0;
  local_328._reader.pointers = (WirePointer *)0x0;
  local_328._reader.segment = (SegmentReader *)0x0;
  local_328._reader.capTable = (CapTableReader *)0x0;
  capnp::schema::Brand::Reader::Reader(&local_328);
  Schema::Schema(&stack0xfffffffffffffcd0);
  brand._reader.capTable = local_328._reader.capTable;
  brand._reader.segment = local_328._reader.segment;
  brand._reader.data = local_328._reader.data;
  brand._reader.pointers = local_328._reader.pointers;
  brand._reader.dataSize = local_328._reader.dataSize;
  brand._reader.pointerCount = local_328._reader.pointerCount;
  brand._reader._38_2_ = local_328._reader._38_2_;
  brand._reader.nestingLimit = local_328._reader.nestingLimit;
  brand._reader._44_4_ = local_328._reader._44_4_;
  local_2f0 = SchemaLoader::get((SchemaLoader *)&schema,uVar2,brand,SStack_330);
  kj::_::DebugExpression<capnp::Schema&>::operator==
            ((DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_2e0,
             (DebugExpression<capnp::Schema&> *)&local_2e8,&local_2f0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2e0);
  if (!bVar1) {
    local_331 = kj::_::Debug::shouldLog(ERROR);
    while (local_331 != false) {
      uVar2 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                        ();
      local_378._reader.dataSize = 0;
      local_378._reader.pointerCount = 0;
      local_378._reader._38_2_ = 0;
      local_378._reader.nestingLimit = 0;
      local_378._reader._44_4_ = 0;
      local_378._reader.data = (void *)0x0;
      local_378._reader.pointers = (WirePointer *)0x0;
      local_378._reader.segment = (SegmentReader *)0x0;
      local_378._reader.capTable = (CapTableReader *)0x0;
      capnp::schema::Brand::Reader::Reader(&local_378);
      Schema::Schema(&local_380);
      brand_00._reader.capTable = local_378._reader.capTable;
      brand_00._reader.segment = local_378._reader.segment;
      brand_00._reader.data = local_378._reader.data;
      brand_00._reader.pointers = local_378._reader.pointers;
      brand_00._reader.dataSize = local_378._reader.dataSize;
      brand_00._reader.pointerCount = local_378._reader.pointerCount;
      brand_00._reader._38_2_ = local_378._reader._38_2_;
      brand_00._reader.nestingLimit = local_378._reader.nestingLimit;
      brand_00._reader._44_4_ = local_378._reader._44_4_;
      local_340 = SchemaLoader::get((SchemaLoader *)&schema,uVar2,brand_00,local_380);
      kj::_::Debug::
      log<char_const(&)[63],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&,capnp::Schema&,capnp::Schema>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x14b,ERROR,
                 "\"failed: expected \" \"(dep) == (loader.get(typeId<TestAllTypes>()))\", _kjCondition, dep, loader.get(typeId<TestAllTypes>())"
                 ,(char (*) [63])"failed: expected (dep) == (loader.get(typeId<TestAllTypes>()))",
                 (DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_2e0,
                 &stack0xfffffffffffffef8,&local_340);
      local_331 = false;
    }
  }
  SchemaLoader::~SchemaLoader((SchemaLoader *)&schema);
  return;
}

Assistant:

TEST(SchemaLoader, LazyLoadGetDependency) {
  FakeLoaderCallback callback(Schema::from<TestAllTypes>().getProto());
  SchemaLoader loader(callback);

  Schema schema = loader.load(Schema::from<TestDefaults>().getProto());

  EXPECT_FALSE(callback.isLoaded());

  Schema dep = schema.getDependency(typeId<TestAllTypes>());

  EXPECT_TRUE(callback.isLoaded());

  EXPECT_EQ(dep.getProto().getDisplayName(),
            Schema::from<TestAllTypes>().getProto().getDisplayName());

  EXPECT_EQ(dep, schema.getDependency(typeId<TestAllTypes>()));
  EXPECT_EQ(dep, loader.get(typeId<TestAllTypes>()));
}